

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Scl(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Gia_Man_t *pGVar2;
  char *pcVar3;
  uint local_44;
  uint local_40;
  int fVerboseFlops;
  int fVerbose;
  int fEquiv;
  int fConst;
  int c;
  Gia_Man_t *pTemp;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  fVerbose = 1;
  fVerboseFlops = 1;
  local_40 = 0;
  local_44 = 0;
  Extra_UtilGetoptReset();
  while (iVar1 = Extra_UtilGetopt(argc,argv,"cevwh"), iVar1 != -1) {
    switch(iVar1) {
    case 99:
      fVerbose = fVerbose ^ 1;
      break;
    default:
      Abc_Print(-2,"usage: &scl [-cevwh]\n");
      Abc_Print(-2,"\t         performs structural sequential cleanup\n");
      pcVar3 = "no";
      if (fVerbose != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-c     : toggle removing stuck-at constant registers [default = %s]\n",pcVar3)
      ;
      pcVar3 = "no";
      if (fVerboseFlops != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-e     : toggle removing equivalent-driver registers [default = %s]\n",pcVar3)
      ;
      pcVar3 = "no";
      if (local_40 != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (local_44 != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-w     : toggle printing verbose info about equivalent flops [default = %s]\n"
                ,pcVar3);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    case 0x65:
      fVerboseFlops = fVerboseFlops ^ 1;
      break;
    case 0x76:
      local_40 = local_40 ^ 1;
      break;
    case 0x77:
      local_44 = local_44 ^ 1;
    }
  }
  if (pAbc->pGia == (Gia_Man_t *)0x0) {
    Abc_Print(-1,"Abc_CommandAbc9Scl(): There is no AIG.\n");
    pAbc_local._4_4_ = 1;
  }
  else {
    iVar1 = Gia_ManBoxNum(pAbc->pGia);
    if ((iVar1 == 0) || (iVar1 = Gia_ManRegBoxNum(pAbc->pGia), iVar1 == 0)) {
      iVar1 = Gia_ManRegNum(pAbc->pGia);
      if (iVar1 == 0) {
        Abc_Print(-1,"The network is combinational.\n");
        pAbc_local._4_4_ = 0;
      }
      else {
        pGVar2 = Gia_ManSeqStructSweep(pAbc->pGia,fVerbose,fVerboseFlops,local_40);
        Abc_FrameUpdateGia(pAbc,pGVar2);
        pAbc_local._4_4_ = 0;
      }
    }
    else if (pAbc->pGia->pAigExtra == (Gia_Man_t *)0x0) {
      printf("Timing manager is given but there is no GIA of boxes.\n");
      pAbc_local._4_4_ = 0;
    }
    else {
      pGVar2 = Gia_ManSweepWithBoxes
                         (pAbc->pGia,(void *)0x0,(void *)0x0,fVerbose,fVerboseFlops,local_40,
                          local_44);
      Abc_FrameUpdateGia(pAbc,pGVar2);
      pAbc_local._4_4_ = 0;
    }
  }
  return pAbc_local._4_4_;
}

Assistant:

int Abc_CommandAbc9Scl( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp;
    int c;
    int fConst = 1;
    int fEquiv = 1;
    int fVerbose = 0;
    int fVerboseFlops = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "cevwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'c':
            fConst ^= 1;
            break;
        case 'e':
            fEquiv ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVerboseFlops ^= 1;
            break;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Scl(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManBoxNum(pAbc->pGia) && Gia_ManRegBoxNum(pAbc->pGia) )
    {
        if ( pAbc->pGia->pAigExtra == NULL )
        {
            printf( "Timing manager is given but there is no GIA of boxes.\n" );
            return 0;
        }
        pTemp = Gia_ManSweepWithBoxes( pAbc->pGia, NULL, NULL, fConst, fEquiv, fVerbose, fVerboseFlops );
        Abc_FrameUpdateGia( pAbc, pTemp );
        return 0;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "The network is combinational.\n" );
        return 0;
    }
    pTemp = Gia_ManSeqStructSweep( pAbc->pGia, fConst, fEquiv, fVerbose );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &scl [-cevwh]\n" );
    Abc_Print( -2, "\t         performs structural sequential cleanup\n" );
    Abc_Print( -2, "\t-c     : toggle removing stuck-at constant registers [default = %s]\n", fConst? "yes": "no" );
    Abc_Print( -2, "\t-e     : toggle removing equivalent-driver registers [default = %s]\n", fEquiv? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w     : toggle printing verbose info about equivalent flops [default = %s]\n", fVerboseFlops? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}